

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O1

bool tinyusdz::makeUniqueName
               (multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *nameSet,string *name,string *unique_name)

{
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  undefined4 extraout_EAX;
  size_type sVar4;
  size_type sVar5;
  ulong uVar6;
  char cVar7;
  string new_name;
  undefined4 local_7c;
  long *local_70;
  uint local_68;
  long local_60 [2];
  key_type local_50;
  
  if (unique_name != (string *)0x0) {
    sVar4 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&nameSet->_M_t,name);
    if (sVar4 != 0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar1 = (name->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
      uVar6 = 0;
      local_7c = extraout_EAX;
      do {
        if (0x3ff < uVar6) {
          local_7c._0_1_ = 0;
          break;
        }
        sVar4 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&nameSet->_M_t,&local_50);
        if (sVar4 == 0) {
          local_7c = 0;
LAB_0029a781:
          bVar2 = false;
        }
        else {
          cVar7 = '\x01';
          if (9 < sVar4) {
            sVar5 = sVar4;
            cVar3 = '\x04';
            do {
              cVar7 = cVar3;
              if (sVar5 < 100) {
                cVar7 = cVar7 + -2;
                goto LAB_0029a705;
              }
              if (sVar5 < 1000) {
                cVar7 = cVar7 + -1;
                goto LAB_0029a705;
              }
              if (sVar5 < 10000) goto LAB_0029a705;
              bVar2 = 99999 < sVar5;
              sVar5 = sVar5 / 10000;
              cVar3 = cVar7 + '\x04';
            } while (bVar2);
            cVar7 = cVar7 + '\x01';
          }
LAB_0029a705:
          local_70 = local_60;
          ::std::__cxx11::string::_M_construct((ulong)&local_70,cVar7);
          std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_70,local_68,sVar4);
          ::std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
          sVar4 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&nameSet->_M_t,&local_50);
          if (sVar4 == 0) {
            ::std::__cxx11::string::_M_assign((string *)unique_name);
            local_7c = 1;
            goto LAB_0029a781;
          }
          uVar6 = uVar6 + 1;
          bVar2 = true;
        }
      } while (bVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0029a7c6;
    }
    ::std::__cxx11::string::_M_assign((string *)unique_name);
  }
  local_7c._0_1_ = 0;
LAB_0029a7c6:
  return (bool)((byte)local_7c & 1);
}

Assistant:

bool makeUniqueName(std::multiset<std::string> &nameSet,
                    const std::string &name, std::string *unique_name) {
  if (!unique_name) {
    return false;
  }

  if (nameSet.count(name) == 0) {
    (*unique_name) = name;
    return 0;
  }

  // Simply add number

  const size_t kMaxLoop = 1024;  // to avoid infinite loop.

  std::string new_name = name;

  size_t cnt = 0;
  while (cnt < kMaxLoop) {
    size_t i = nameSet.count(new_name);
    if (i == 0) {
      // This should not happen though.
      return false;
    }

    new_name += std::to_string(i);

    if (nameSet.count(new_name) == 0) {
      (*unique_name) = new_name;
      return true;
    }

    cnt++;
  }

  return false;
}